

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.cpp
# Opt level: O0

VRLocation * __thiscall dg::vr::VRCodeGraph::newVRLocation(VRCodeGraph *this,Instruction *inst)

{
  VRLocation *this_00;
  VRLocation *loc;
  VRCodeGraph *in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffd9;
  
  this_00 = newVRLocation(in_stack_ffffffffffffffd0);
  std::
  map<llvm::Instruction_const*,dg::vr::VRLocation*,std::less<llvm::Instruction_const*>,std::allocator<std::pair<llvm::Instruction_const*const,dg::vr::VRLocation*>>>
  ::emplace<llvm::Instruction_const*&,dg::vr::VRLocation*>
            ((map<const_llvm::Instruction_*,_dg::vr::VRLocation_*,_std::less<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_dg::vr::VRLocation_*>_>_>
              *)this_00,
             (Instruction **)CONCAT71(in_stack_ffffffffffffffd9,in_stack_ffffffffffffffd8),
             (VRLocation **)in_stack_ffffffffffffffd0);
  return this_00;
}

Assistant:

VRLocation &VRCodeGraph::newVRLocation(const llvm::Instruction *inst) {
    assert(locationMapping.find(inst) == locationMapping.end());

    VRLocation &loc = newVRLocation();
    locationMapping.emplace(inst, &loc);
    return loc;
}